

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFeatureElement::IfcFeatureElement(IfcFeatureElement *this)

{
  IfcFeatureElement *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcElement).field_0x148,"IfcFeatureElement");
  IfcElement::IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__0106d508);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFeatureElement,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFeatureElement,_0UL> *)
             &(this->super_IfcElement).field_0x138,&PTR_construction_vtable_24__0106d5f8);
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x106d400;
  *(undefined8 *)&(this->super_IfcElement).field_0x148 = 0x106d4f0;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x106d428;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x106d450;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x106d478;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0x106d4a0;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0x106d4c8;
  return;
}

Assistant:

IfcFeatureElement() : Object("IfcFeatureElement") {}